

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::DtlsSession::SetClientTransportId(Error *__return_storage_ptr__,DtlsSession *this)

{
  ErrorCode EVar1;
  int aMbedtlsError;
  char *pcVar2;
  char *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  Address peerAddr;
  uchar *local_c0;
  uchar *local_b8;
  string local_a8;
  undefined1 local_88 [8];
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  parse_func local_60 [1];
  ErrorCode local_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  if ((this->mIsServer != true) || (this->mIsClientIdSet == true)) {
    abort();
  }
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  (*(this->super_Endpoint)._vptr_Endpoint[3])(&local_c0,this);
  if (local_c0 == local_b8) {
    local_88._0_4_ = none_type;
    local_80._M_p = "has no valid peer address";
    local_78 = 0x19;
    local_70._M_allocated_capacity = 0;
    local_60[0] = (parse_func)0x0;
    begin = "has no valid peer address";
    local_70._8_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_88;
    do {
      pcVar2 = begin + 1;
      if (*begin == '}') {
        if ((pcVar2 == "") || (*pcVar2 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar2 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar2 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",(format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_88);
      }
      begin = pcVar2;
    } while (pcVar2 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_88;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_a8,(v10 *)"has no valid peer address",(string_view)ZEXT816(0x19),args);
    local_50 = kInvalidState;
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,local_a8._M_dataplus._M_p,
               local_a8._M_dataplus._M_p + local_a8._M_string_length);
    __return_storage_ptr__->mCode = local_50;
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
  }
  else {
    aMbedtlsError =
         mbedtls_ssl_set_client_transport_id(&this->mSsl,local_c0,(long)local_b8 - (long)local_c0);
    ErrorFromMbedtlsError((Error *)local_88,aMbedtlsError);
    __return_storage_ptr__->mCode = local_88._0_4_;
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)&local_80)
    ;
    EVar1 = __return_storage_ptr__->mCode;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_p != &local_70) {
      operator_delete(local_80._M_p);
    }
    if (EVar1 == kNone) {
      this->mIsClientIdSet = true;
    }
  }
  if (local_c0 != (uchar *)0x0) {
    operator_delete(local_c0);
  }
  return __return_storage_ptr__;
}

Assistant:

Error DtlsSession::SetClientTransportId()
{
    VerifyOrDie(mIsServer && !mIsClientIdSet);

    Error error;
    int   fail;
    auto  peerAddr = GetPeerAddr();

    VerifyOrExit(peerAddr.IsValid(), error = ERROR_INVALID_STATE("has no valid peer address"));

    fail = mbedtls_ssl_set_client_transport_id(&mSsl, reinterpret_cast<const uint8_t *>(peerAddr.GetRaw().data()),
                                               peerAddr.GetRaw().size());
    SuccessOrExit(error = ErrorFromMbedtlsError(fail));

    mIsClientIdSet = true;

exit:
    return error;
}